

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O3

void __thiscall
ScriptMemoryDumper::DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket)

{
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  
  pSVar1 = &heapBucket->allocatorHead;
  do {
    DumpSmallHeapBlock<MediumAllocationBlockAttributes>
              (this,&pSVar1->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
    pSVar1 = pSVar1->next;
  } while (pSVar1 != &heapBucket->allocatorHead);
  for (pSVar2 = &heapBucket->fullBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0; pSVar2 = pSVar2->next) {
    DumpSmallHeapBlock<MediumAllocationBlockAttributes>(this,pSVar2);
  }
  for (pSVar2 = &heapBucket->heapBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0; pSVar2 = pSVar2->next) {
    DumpSmallHeapBlock<MediumAllocationBlockAttributes>(this,pSVar2);
  }
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}